

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O3

void synthetic_create_rec(stagewise_poly *poly,float v,uint64_t findex)

{
  size_t *psVar1;
  feature *pfVar2;
  vw *pvVar3;
  example *ec;
  uint64_t uVar4;
  float *pfVar5;
  uint64_t uVar6;
  float fVar7;
  undefined4 uVar8;
  ulong uVar9;
  byte bVar10;
  uint32_t *puVar11;
  uint64_t *puVar12;
  ulong uVar13;
  byte *pbVar14;
  unsigned_long *puVar15;
  ulong uVar16;
  uint8_t *puVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong i;
  float *pfVar21;
  byte *pbVar22;
  bool bVar23;
  float v_00;
  example_predict *__range3;
  feature parent_f;
  
  uVar9 = (poly->synth_ec).super_example_predict.ft_offset;
  if (uVar9 != 0) {
    if (findex < uVar9) {
      pvVar3 = poly->all;
      puVar11 = &(pvVar3->weights).dense_weights._stride_shift;
      if ((pvVar3->weights).sparse != false) {
        puVar11 = &(pvVar3->weights).sparse_weights._stride_shift;
      }
      do {
        findex = findex + ((1L << ((byte)pvVar3->num_bits & 0x3f)) << ((byte)*puVar11 & 0x3f));
      } while (findex < uVar9);
    }
    findex = findex - uVar9;
  }
  pvVar3 = poly->all;
  puVar11 = &(pvVar3->weights).dense_weights._stride_shift;
  puVar12 = &(pvVar3->weights).dense_weights._weight_mask;
  if ((pvVar3->weights).sparse != false) {
    puVar11 = &(pvVar3->weights).sparse_weights._stride_shift;
    puVar12 = &(pvVar3->weights).sparse_weights._weight_mask;
  }
  uVar13 = *puVar12;
  bVar10 = (byte)*puVar11;
  uVar16 = findex & uVar13;
  uVar19 = (poly->synth_rec_f).weight_index;
  uVar18 = (ulong)pvVar3->wpp * 0xb1c55c << (bVar10 & 0x3f) & uVar13;
  i = uVar19;
  if ((uVar18 != uVar16) && (i = uVar16, uVar18 != uVar19)) {
    i = ((uVar19 >> (bVar10 & 0x3f)) * 0x1000193 ^ uVar16 >> (bVar10 & 0x3f)) << (bVar10 & 0x3f) &
        uVar13;
  }
  uVar19 = uVar9 + i >> (bVar10 & 0x3f);
  uVar20 = poly->cur_depth;
  puVar17 = poly->depthsbits;
  if ((uVar20 < puVar17[uVar19 * 2]) && (poly->training == true)) {
    uVar9 = (uVar9 + i & uVar13) >> (bVar10 & 0x3f);
    if ((puVar17[uVar9 * 2 + 1] & 1) != 0) {
      puVar17[uVar9 * 2 + 1] = puVar17[uVar9 * 2 + 1] & 0xfe;
      uVar20 = poly->cur_depth;
      pvVar3 = poly->all;
      puVar17 = poly->depthsbits;
      puVar11 = &(pvVar3->weights).dense_weights._stride_shift;
      if (((pvVar3->weights).sparse & 1U) != 0) {
        puVar11 = &(pvVar3->weights).sparse_weights._stride_shift;
      }
      uVar19 = (poly->synth_ec).super_example_predict.ft_offset + i >> ((byte)*puVar11 & 0x3f);
    }
    puVar17[uVar19 * 2] = (uint8_t)uVar20;
    pvVar3 = poly->all;
    puVar17 = poly->depthsbits;
    bVar23 = ((pvVar3->weights).sparse & 1U) != 0;
    puVar12 = &(pvVar3->weights).dense_weights._weight_mask;
    if (bVar23) {
      puVar12 = &(pvVar3->weights).sparse_weights._weight_mask;
    }
    uVar13 = *puVar12;
    puVar11 = &(pvVar3->weights).dense_weights._stride_shift;
    if (bVar23) {
      puVar11 = &(pvVar3->weights).sparse_weights._stride_shift;
    }
    bVar10 = (byte)*puVar11;
  }
  uVar9 = (uVar13 & i) >> (bVar10 & 0x3f);
  if ((puVar17[uVar9 * 2 + 1] & 2) == 0) {
    uVar20 = 0x7f;
    if (poly->cur_depth < 0x7f) {
      uVar20 = poly->cur_depth;
    }
    if (uVar20 == puVar17[((poly->synth_ec).super_example_predict.ft_offset + i >> (bVar10 & 0x3f))
                          * 2]) {
      puVar17[uVar9 * 2 + 1] = puVar17[uVar9 * 2 + 1] | 2;
      v_00 = v * (poly->synth_rec_f).x;
      features::push_back((poly->synth_ec).super_example_predict.feature_space + 0x86,v_00,i);
      psVar1 = &(poly->synth_ec).num_features;
      *psVar1 = *psVar1 + 1;
      pvVar3 = poly->all;
      puVar11 = &(pvVar3->weights).dense_weights._stride_shift;
      puVar12 = &(pvVar3->weights).dense_weights._weight_mask;
      if ((pvVar3->weights).sparse != false) {
        puVar11 = &(pvVar3->weights).sparse_weights._stride_shift;
        puVar12 = &(pvVar3->weights).sparse_weights._weight_mask;
      }
      if ((poly->depthsbits
           [(((poly->synth_ec).super_example_predict.ft_offset + i & *puVar12) >>
            ((byte)*puVar11 & 0x3f)) * 2 + 1] & 1) != 0) {
        pfVar2 = &poly->synth_rec_f;
        fVar7 = pfVar2->x;
        uVar8 = *(undefined4 *)&pfVar2->field_0x4;
        uVar6 = (poly->synth_rec_f).weight_index;
        (poly->synth_rec_f).x = v_00;
        (poly->synth_rec_f).weight_index = i;
        poly->cur_depth = poly->cur_depth + 1;
        ec = poly->original_ec;
        bVar23 = pvVar3->permutations;
        uVar4 = (ec->super_example_predict).ft_offset;
        pbVar22 = (ec->super_example_predict).indices._begin;
        pbVar14 = (ec->super_example_predict).indices._end;
        if ((pvVar3->weights).sparse == true) {
          if (pvVar3->ignore_some_linear == false) {
            for (; pbVar22 != pbVar14; pbVar22 = pbVar22 + 1) {
              bVar10 = *pbVar22;
              pfVar21 = (ec->super_example_predict).feature_space[bVar10].values._begin;
              pfVar5 = (ec->super_example_predict).feature_space[bVar10].values._end;
              if (pfVar21 != pfVar5) {
                puVar15 = (ec->super_example_predict).feature_space[bVar10].indicies._begin;
                do {
                  synthetic_create_rec(poly,*pfVar21,*puVar15 + uVar4);
                  pfVar21 = pfVar21 + 1;
                  puVar15 = puVar15 + 1;
                } while (pfVar21 != pfVar5);
              }
            }
          }
          else {
            for (; pbVar22 != pbVar14; pbVar22 = pbVar22 + 1) {
              bVar10 = *pbVar22;
              if (pvVar3->ignore_linear[bVar10] == false) {
                pfVar21 = (ec->super_example_predict).feature_space[bVar10].values._begin;
                pfVar5 = (ec->super_example_predict).feature_space[bVar10].values._end;
                if (pfVar21 != pfVar5) {
                  puVar15 = (ec->super_example_predict).feature_space[bVar10].indicies._begin;
                  do {
                    synthetic_create_rec(poly,*pfVar21,*puVar15 + uVar4);
                    pfVar21 = pfVar21 + 1;
                    puVar15 = puVar15 + 1;
                  } while (pfVar21 != pfVar5);
                  pbVar14 = (ec->super_example_predict).indices._end;
                }
              }
            }
          }
          INTERACTIONS::
          generate_interactions<stagewise_poly,_unsigned_long,_&synthetic_create_rec,_false,_&GD::dummy_func,_sparse_parameters>
                    (&pvVar3->interactions,bVar23,&ec->super_example_predict,poly,
                     &(pvVar3->weights).sparse_weights);
        }
        else {
          if (pvVar3->ignore_some_linear == false) {
            for (; pbVar22 != pbVar14; pbVar22 = pbVar22 + 1) {
              bVar10 = *pbVar22;
              pfVar21 = (ec->super_example_predict).feature_space[bVar10].values._begin;
              pfVar5 = (ec->super_example_predict).feature_space[bVar10].values._end;
              if (pfVar21 != pfVar5) {
                puVar15 = (ec->super_example_predict).feature_space[bVar10].indicies._begin;
                do {
                  synthetic_create_rec(poly,*pfVar21,*puVar15 + uVar4);
                  pfVar21 = pfVar21 + 1;
                  puVar15 = puVar15 + 1;
                } while (pfVar21 != pfVar5);
              }
            }
          }
          else {
            for (; pbVar22 != pbVar14; pbVar22 = pbVar22 + 1) {
              bVar10 = *pbVar22;
              if (pvVar3->ignore_linear[bVar10] == false) {
                pfVar21 = (ec->super_example_predict).feature_space[bVar10].values._begin;
                pfVar5 = (ec->super_example_predict).feature_space[bVar10].values._end;
                if (pfVar21 != pfVar5) {
                  puVar15 = (ec->super_example_predict).feature_space[bVar10].indicies._begin;
                  do {
                    synthetic_create_rec(poly,*pfVar21,*puVar15 + uVar4);
                    pfVar21 = pfVar21 + 1;
                    puVar15 = puVar15 + 1;
                  } while (pfVar21 != pfVar5);
                  pbVar14 = (ec->super_example_predict).indices._end;
                }
              }
            }
          }
          INTERACTIONS::
          generate_interactions<stagewise_poly,_unsigned_long,_&synthetic_create_rec,_false,_&GD::dummy_func,_dense_parameters>
                    (&pvVar3->interactions,bVar23,&ec->super_example_predict,poly,
                     &(pvVar3->weights).dense_weights);
        }
        poly->cur_depth = poly->cur_depth - 1;
        pfVar2->x = fVar7;
        *(undefined4 *)&pfVar2->field_0x4 = uVar8;
        (poly->synth_rec_f).weight_index = uVar6;
      }
    }
  }
  return;
}

Assistant:

void synthetic_create_rec(stagewise_poly &poly, float v, uint64_t findex)
{
  // Note: need to un_ft_shift since gd::foreach_feature bakes in the offset.
  uint64_t wid_atomic = wid_mask(poly, un_ft_offset(poly, findex));
  uint64_t wid_cur = child_wid(poly, wid_atomic, poly.synth_rec_f.weight_index);
  assert(wid_atomic % stride_shift(poly, 1) == 0);

  // Note: only mutate learner state when in training mode.  This is because
  // the average test errors across multiple data sets should be equal to
  // the test error on the merged dataset (which is violated if the code
  // below is run at training time).
  if (poly.cur_depth < min_depths_get(poly, wid_cur) && poly.training)
  {
    if (parent_get(poly, wid_cur))
    {
#ifdef DEBUG
      cout << "FOUND A TRANSPLANT!!! moving [" << wid_cur << "] from depth " << (uint64_t)min_depths_get(poly, wid_cur)
           << " to depth " << poly.cur_depth << endl;
#endif  // DEBUG
      // XXX arguably, should also fear transplants that occured with
      // a different ft_offset ; e.g., need to look out for cross-reduction
      // collisions.  Have not played with this issue yet...
      parent_toggle(poly, wid_cur);
    }
    min_depths_set(poly, wid_cur, poly.cur_depth);
  }

  if (!cycle_get(poly, wid_cur) &&
      ((poly.cur_depth > default_depth ? default_depth : poly.cur_depth) == min_depths_get(poly, wid_cur)))
  {
    cycle_toggle(poly, wid_cur);

#ifdef DEBUG
    ++poly.depths[poly.cur_depth];
#endif  // DEBUG

    feature temp = {v * poly.synth_rec_f.x, wid_cur};
    poly.synth_ec.feature_space[tree_atomics].push_back(temp.x, temp.weight_index);
    poly.synth_ec.num_features++;

    if (parent_get(poly, temp.weight_index))
    {
      feature parent_f = poly.synth_rec_f;
      poly.synth_rec_f = temp;
      ++poly.cur_depth;
#ifdef DEBUG
      poly.max_depth = (poly.max_depth > poly.cur_depth) ? poly.max_depth : poly.cur_depth;
#endif  // DEBUG
      GD::foreach_feature<stagewise_poly, uint64_t, synthetic_create_rec>(*(poly.all), *(poly.original_ec), poly);
      --poly.cur_depth;
      poly.synth_rec_f = parent_f;
    }
  }
}